

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

bool GUIComponentSave(string *path,vector<GUIComponent,_std::allocator<GUIComponent>_> *components)

{
  pointer pGVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  GUIComponent *component;
  pointer pGVar5;
  char *pcVar6;
  ofstream file;
  
  std::ofstream::ofstream(&file,(string *)path,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    pGVar1 = (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pGVar5 = (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>).
                  _M_impl.super__Vector_impl_data._M_start; pGVar5 != pGVar1; pGVar5 = pGVar5 + 1) {
      switch(pGVar5->Type) {
      case EGUIComponentTypeSlider1:
        poVar3 = std::operator<<((ostream *)&file,(string *)&pGVar5->UniformName);
        std::operator<<(poVar3," s1 ");
        lVar4 = 0x34;
        break;
      case EGUIComponentTypeSlider2:
        poVar3 = std::operator<<((ostream *)&file,(string *)&pGVar5->UniformName);
        std::operator<<(poVar3," s2 ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&file,pGVar5->Data[0]);
        std::operator<<(poVar3," ");
        lVar4 = 0x38;
        break;
      case EGUIComponentTypeSlider3:
        poVar3 = std::operator<<((ostream *)&file,(string *)&pGVar5->UniformName);
        pcVar6 = " s3 ";
        goto LAB_00115f88;
      case EGUIComponentTypeSlider4:
        poVar3 = std::operator<<((ostream *)&file,(string *)&pGVar5->UniformName);
        pcVar6 = " s4 ";
        goto LAB_00116028;
      case EGUIComponentTypeColor3:
        poVar3 = std::operator<<((ostream *)&file,(string *)&pGVar5->UniformName);
        pcVar6 = " c3 ";
LAB_00115f88:
        std::operator<<(poVar3,pcVar6);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&file,pGVar5->Data[0]);
        std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&file,pGVar5->Data[1]);
        std::operator<<(poVar3," ");
        lVar4 = 0x3c;
        break;
      case EGUIComponentTypeColor4:
        poVar3 = std::operator<<((ostream *)&file,(string *)&pGVar5->UniformName);
        pcVar6 = " c4 ";
LAB_00116028:
        std::operator<<(poVar3,pcVar6);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&file,pGVar5->Data[0]);
        std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&file,pGVar5->Data[1]);
        std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&file,pGVar5->Data[2]);
        std::operator<<(poVar3," ");
        lVar4 = 0x40;
        break;
      default:
        goto switchD_00115f3b_default;
      }
      std::ostream::operator<<((ostream *)&file,*(float *)((long)pGVar5->Data + lVar4 + -0x34));
      std::endl<char,std::char_traits<char>>((ostream *)&file);
switchD_00115f3b_default:
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&file);
  return (bool)cVar2;
}

Assistant:

bool GUIComponentSave(const std::string& path, const std::vector<GUIComponent>& components) {
    std::ofstream file(path);
    
    if (!file.is_open()) {
        return false;
    }
    
    for (const GUIComponent& component : components) {
        switch (component.Type) {
            case EGUIComponentTypeSlider1:
                file << component.UniformName << " s1 ";
                file << component.Data[0];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider2:
                file << component.UniformName << " s2 ";
                file << component.Data[0] << " ";
                file << component.Data[1];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider3:
                file << component.UniformName << " s3 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider4:
                file << component.UniformName << " s4 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2] << " ";
                file << component.Data[3];
                file << std::endl;
                break;
            case EGUIComponentTypeColor3:
                file << component.UniformName << " c3 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2];
                file << std::endl;
                break;
            case EGUIComponentTypeColor4:
                file << component.UniformName << " c4 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2] << " ";
                file << component.Data[3];
                file << std::endl;
                break;
        }
    }
    
    file.close();
    return true;
}